

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O3

Matrix3x3 * CGL::Matrix3x3::identity(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  double *pdVar4;
  int i;
  long lVar5;
  Matrix3x3 *B;
  double *in_RDI;
  long lVar6;
  undefined1 auVar7 [16];
  bool bVar9;
  undefined8 uVar10;
  long lVar8;
  
  auVar2 = _DAT_001ab0f0;
  auVar1 = _DAT_001ab030;
  lVar3 = 0;
  lVar5 = 0;
  pdVar4 = in_RDI;
  do {
    lVar6 = 0;
    auVar7 = auVar2;
    do {
      bVar9 = SUB164(auVar7 ^ auVar1,4) == -0x80000000 && SUB164(auVar7 ^ auVar1,0) < -0x7ffffffd;
      if (bVar9) {
        uVar10 = 0x3ff0000000000000;
        if (lVar3 != lVar6) {
          uVar10 = 0;
        }
        *(undefined8 *)((long)pdVar4 + lVar6) = uVar10;
      }
      if (bVar9) {
        uVar10 = 0x3ff0000000000000;
        if (lVar3 + -0x18 != lVar6) {
          uVar10 = 0;
        }
        *(undefined8 *)((long)pdVar4 + lVar6 + 0x18) = uVar10;
      }
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar8 + 2;
      lVar6 = lVar6 + 0x30;
    } while (lVar6 != 0x60);
    lVar5 = lVar5 + 1;
    lVar3 = lVar3 + 0x18;
    pdVar4 = pdVar4 + 1;
  } while (lVar5 != 3);
  *in_RDI = 1.0;
  in_RDI[1] = 0.0;
  *(undefined1 (*) [16])(in_RDI + 6) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(in_RDI + 2) = (undefined1  [16])0x0;
  in_RDI[4] = 1.0;
  in_RDI[5] = 0.0;
  in_RDI[8] = 1.0;
  return (Matrix3x3 *)in_RDI;
}

Assistant:

Matrix3x3 Matrix3x3::identity( void ) {
    Matrix3x3 B;

    B(0,0) = 1.; B(0,1) = 0.; B(0,2) = 0.;
    B(1,0) = 0.; B(1,1) = 1.; B(1,2) = 0.;
    B(2,0) = 0.; B(2,1) = 0.; B(2,2) = 1.;

    return B;
  }